

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

optional<std::array<unsigned_int,_3UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_value<std::array<unsigned_int,3ul>>
          (optional<std::array<unsigned_int,_3UL>_> *__return_storage_ptr__,PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  bool bVar3;
  optional<std::array<unsigned_int,_3UL>_> local_28;
  
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    bVar3 = false;
  }
  else {
    uVar2 = (*pvVar1->type_id)();
    bVar3 = uVar2 == 4;
  }
  if ((bVar3) || ((this->_blocked & 1U) != 0)) {
LAB_001de98a:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  }
  else {
    pvVar1 = (this->_value).v_.vtable;
    if (pvVar1 != (vtable_type *)0x0) {
      uVar2 = (*pvVar1->type_id)();
      if (uVar2 == 0) goto LAB_001de98a;
    }
    pvVar1 = (this->_value).v_.vtable;
    if (pvVar1 != (vtable_type *)0x0) {
      uVar2 = (*pvVar1->type_id)();
      if (uVar2 == 1) goto LAB_001de98a;
    }
    tinyusdz::value::Value::get_value<std::array<unsigned_int,3ul>>(&local_28,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_28.has_value_;
    if (local_28.has_value_ == true) {
      *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_28.contained._8_4_;
      *(undefined8 *)&__return_storage_ptr__->contained = local_28.contained._0_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }